

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O3

void * deallocmem(memory *m,int elemsize)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  
  if (m->first < m->current) {
    pvVar3 = (void *)((long)m->current - (long)elemsize);
    m->current = pvVar3;
    return pvVar3;
  }
  iVar2 = m->nr;
  uVar1 = iVar2 - 1;
  m->nr = uVar1;
  if (0 < iVar2) {
    pvVar3 = m->block[uVar1];
    m->first = pvVar3;
    pvVar3 = (void *)((long)pvVar3 + ((long)m->blocksize - (long)elemsize));
    m->last = pvVar3;
    m->current = pvVar3;
    return pvVar3;
  }
  m->current = (void *)0x0;
  m->first = (void *)0x0;
  m->last = (void *)0x0;
  return (void *)0x0;
}

Assistant:

void *deallocmem(memory *m, int elemsize)
{
   if (m->current > m->first)
      m->current = (void *) ((char *) (m->current) - elemsize);
   else {
      m->nr--;
      if (m->nr >= 0) {
         m->first = m->block[m->nr];
         m->current = m->last = (void *)
            ((char *) (m->first) + m->blocksize - elemsize);
      } else
         m->current = m->first = m->last = NULL;
   }
   return m->current;
}